

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileTargetGenerator::GenDefFile
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *real_link_commands)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratorTarget *this_00;
  pointer pcVar2;
  cmMakefile *this_01;
  pointer pbVar3;
  pointer ppcVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  _Alloc_hider _Var5;
  int iVar6;
  ModuleDefinitionInfo *path;
  string *psVar7;
  ostream *poVar8;
  string *obj_1;
  cmOutputConverter *pcVar9;
  pointer pbVar10;
  string *obj;
  pointer ppcVar11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view source;
  string_view source_00;
  string_view source_01;
  string_view source_02;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string cmd;
  string objlist_file;
  cmGeneratedFileStream fout;
  string local_370;
  value_type local_350;
  string local_330;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_300;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  size_type local_278;
  pointer local_270;
  undefined8 local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_260;
  
  this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)local_298,this);
  path = cmGeneratorTarget::GetModuleDefinitionInfo(this_00,(string *)local_298);
  if ((undefined1 *)local_298._0_8_ != local_288) {
    operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
  }
  if ((path != (ModuleDefinitionInfo *)0x0) && (path->DefFileGenerated != false)) {
    local_300 = real_link_commands;
    psVar7 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    pcVar2 = (psVar7->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_350,pcVar2,pcVar2 + psVar7->_M_string_length);
    source._M_str = local_350._M_dataplus._M_p;
    source._M_len = local_350._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_2b8,
               &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,source,SHELL);
    _Var5._M_p = local_2b8._M_dataplus._M_p;
    pcVar9 = &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
              super_cmOutputConverter;
    cmOutputConverter::MaybeRelativeToCurBinDir(&local_2f8,pcVar9,&path->DefFile);
    source_00._M_str = local_2f8._M_dataplus._M_p;
    source_00._M_len = local_2f8._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&local_2d8,pcVar9,source_00,SHELL);
    local_298._0_8_ = local_2b8._M_string_length;
    local_298._8_8_ = _Var5._M_p;
    local_288._0_8_ = 0x11;
    local_288._8_8_ = " -E __create_def ";
    local_278 = local_2d8._M_string_length;
    local_270 = local_2d8._M_dataplus._M_p;
    paVar1 = &local_330.field_2;
    local_330._M_dataplus._M_p = &DAT_00000001;
    local_330.field_2._M_local_buf[0] = ' ';
    local_268 = 1;
    views._M_len = 4;
    views._M_array = (iterator)local_298;
    local_330._M_string_length = (size_type)paVar1;
    local_260 = paVar1;
    cmCatViews_abi_cxx11_(&local_370,views);
    std::__cxx11::string::operator=((string *)&local_350,(string *)&local_370);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (path->DefFile)._M_dataplus._M_p;
    local_330._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_330,pcVar2,pcVar2 + (path->DefFile)._M_string_length);
    std::__cxx11::string::append((char *)&local_330);
    pcVar9 = &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
              super_cmOutputConverter;
    cmOutputConverter::MaybeRelativeToCurBinDir(&local_370,pcVar9,&local_330);
    source_01._M_str = local_370._M_dataplus._M_p;
    source_01._M_len = local_370._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_((string *)local_298,pcVar9,source_01,SHELL);
    std::__cxx11::string::_M_append((char *)&local_350,local_298._0_8_);
    if ((undefined1 *)local_298._0_8_ != local_288) {
      operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    this_01 = (this->super_cmCommonTargetGenerator).Makefile;
    local_298._0_8_ = local_288;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"CMAKE_NM","");
    this_02 = local_300;
    psVar7 = (string *)cmMakefile::GetDefinition(this_01,(string *)local_298);
    if ((undefined1 *)local_298._0_8_ != local_288) {
      operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
    }
    if ((psVar7 != (string *)0x0) && (psVar7->_M_string_length != 0)) {
      std::__cxx11::string::append((char *)&local_350);
      if (psVar7 == (string *)0x0) {
        psVar7 = &cmValue::Empty_abi_cxx11_;
      }
      source_02._M_str = (psVar7->_M_dataplus)._M_p;
      source_02._M_len = psVar7->_M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                ((string *)local_298,
                 &(((this->super_cmCommonTargetGenerator).LocalCommonGenerator)->
                  super_cmLocalGenerator).super_cmOutputConverter,source_02,SHELL);
      std::__cxx11::string::_M_append((char *)&local_350,local_298._0_8_);
      if ((undefined1 *)local_298._0_8_ != local_288) {
        operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(this_02,(this_02->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,&local_350);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_298,&local_330,false,None);
    if (path->WindowsExportAllSymbols == true) {
      pbVar10 = (this->Objects).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (this->Objects).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar10 != pbVar3) {
        do {
          local_370._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
          local_370._M_dataplus._M_p = (pointer)pbVar10->_M_string_length;
          if ((char *)0x3 < local_370._M_dataplus._M_p) {
            __str._M_str = ".obj";
            __str._M_len = 4;
            iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                              ((basic_string_view<char,_std::char_traits<char>_> *)&local_370,
                               (size_type)(local_370._M_dataplus._M_p + -4),4,__str);
            if (iVar6 == 0) {
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_298,(pbVar10->_M_dataplus)._M_p,
                                  pbVar10->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            }
          }
          pbVar10 = pbVar10 + 1;
        } while (pbVar10 != pbVar3);
      }
      pbVar10 = (this->ExternalObjects).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (this->ExternalObjects).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar10 != pbVar3) {
        do {
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_298,(pbVar10->_M_dataplus)._M_p,
                              pbVar10->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          pbVar10 = pbVar10 + 1;
        } while (pbVar10 != pbVar3);
      }
    }
    ppcVar11 = (path->Sources).
               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppcVar4 = (path->Sources).
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppcVar11 != ppcVar4) {
      do {
        psVar7 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar11);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_298,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        ppcVar11 = ppcVar11 + 1;
      } while (ppcVar11 != ppcVar4);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,
                      CONCAT71(local_330.field_2._M_allocated_capacity._1_7_,
                               local_330.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::GenDefFile(
  std::vector<std::string>& real_link_commands)
{
  cmGeneratorTarget::ModuleDefinitionInfo const* mdi =
    this->GeneratorTarget->GetModuleDefinitionInfo(this->GetConfigName());
  if (!mdi || !mdi->DefFileGenerated) {
    return;
  }
  std::string cmd = cmSystemTools::GetCMakeCommand();
  cmd = cmStrCat(
    this->LocalGenerator->ConvertToOutputFormat(cmd, cmOutputConverter::SHELL),
    " -E __create_def ",
    this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeRelativeToCurBinDir(mdi->DefFile),
      cmOutputConverter::SHELL),
    ' ');
  std::string objlist_file = mdi->DefFile + ".objs";
  cmd += this->LocalGenerator->ConvertToOutputFormat(
    this->LocalGenerator->MaybeRelativeToCurBinDir(objlist_file),
    cmOutputConverter::SHELL);
  cmValue nm_executable = this->Makefile->GetDefinition("CMAKE_NM");
  if (cmNonempty(nm_executable)) {
    cmd += " --nm=";
    cmd += this->LocalCommonGenerator->ConvertToOutputFormat(
      *nm_executable, cmOutputConverter::SHELL);
  }
  real_link_commands.insert(real_link_commands.begin(), cmd);
  // create a list of obj files for the -E __create_def to read
  cmGeneratedFileStream fout(objlist_file);

  if (mdi->WindowsExportAllSymbols) {
    for (std::string const& obj : this->Objects) {
      if (cmHasLiteralSuffix(obj, ".obj")) {
        fout << obj << "\n";
      }
    }
    for (std::string const& obj : this->ExternalObjects) {
      fout << obj << "\n";
    }
  }

  for (cmSourceFile const* src : mdi->Sources) {
    fout << src->GetFullPath() << "\n";
  }
}